

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

bool __thiscall ON_UnitSystem::IsValid(ON_UnitSystem *this)

{
  LengthUnitSystem LVar1;
  LengthUnitSystem LVar2;
  bool bVar3;
  
  LVar1 = this->m_unit_system;
  LVar2 = ON::LengthUnitSystemFromUnsigned((uint)LVar1);
  if ((LVar1 == LVar2) && (this->m_unit_system != Unset)) {
    if (this->m_unit_system == CustomUnits) {
      bVar3 = ON_IsValidPositiveNumber(this->m_meters_per_custom_unit);
      if (!bVar3) goto LAB_00371766;
    }
    bVar3 = true;
  }
  else {
LAB_00371766:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_UnitSystem::IsValid() const
{
  if ( m_unit_system != ON::LengthUnitSystemFromUnsigned(static_cast<unsigned int>(m_unit_system)) )
  {
    // invalid enum value
    return false;
  }

  if (ON::LengthUnitSystem::Unset == m_unit_system)
    return false;

  if (ON::LengthUnitSystem::CustomUnits == m_unit_system)
  {
    if (false == ON_IsValidPositiveNumber(m_meters_per_custom_unit))
      return false;
  }

  return true;
}